

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
          (CompilerGLSL *this,char (*t) [14],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2])

{
  char (*ts_local_3) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_2;
  char (*ts_local_1) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  char (*t_local) [14];
  CompilerGLSL *this_local;
  
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}